

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.h
# Opt level: O2

void tf_dealloc_data(TemporalFilterData *tf_data,int is_high_bitdepth)

{
  if (is_high_bitdepth != 0) {
    tf_data->pred = (uint8_t *)((long)tf_data->pred << 1);
  }
  aom_free(tf_data->tmp_mbmi);
  tf_data->tmp_mbmi = (MB_MODE_INFO *)0x0;
  aom_free(tf_data->accum);
  tf_data->accum = (uint32_t *)0x0;
  aom_free(tf_data->count);
  tf_data->count = (uint16_t *)0x0;
  aom_free(tf_data->pred);
  tf_data->pred = (uint8_t *)0x0;
  return;
}

Assistant:

static inline void tf_dealloc_data(TemporalFilterData *tf_data,
                                   int is_high_bitdepth) {
  if (is_high_bitdepth)
    tf_data->pred = (uint8_t *)CONVERT_TO_SHORTPTR(tf_data->pred);
  aom_free(tf_data->tmp_mbmi);
  tf_data->tmp_mbmi = NULL;
  aom_free(tf_data->accum);
  tf_data->accum = NULL;
  aom_free(tf_data->count);
  tf_data->count = NULL;
  aom_free(tf_data->pred);
  tf_data->pred = NULL;
}